

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

int assetsys_file_size(assetsys_t *sys,assetsys_file_t file)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_b8 [8];
  stat s;
  assetsys_internal_mount_t *mount;
  int mount_index;
  assetsys_t *sys_local;
  
  iVar1 = assetsys_internal_find_mount_index(sys,file.mount,file.path);
  if (iVar1 < 0) {
    sys_local._4_4_ = 0;
  }
  else {
    s.__glibc_reserved[2] = (__syscall_slong_t)(sys->mounts + iVar1);
    if (((assetsys_internal_mount_t *)s.__glibc_reserved[2])->type ==
        ASSETSYS_INTERNAL_MOUNT_TYPE_DIR) {
      pcVar2 = assetsys_internal_get_string
                         (sys,((assetsys_internal_mount_t *)s.__glibc_reserved[2])->path);
      strcpy(sys->temp,pcVar2);
      pcVar2 = "/";
      if (sys->temp[0] == '\0') {
        pcVar2 = "";
      }
      strcat(sys->temp,pcVar2);
      pcVar2 = assetsys_internal_get_string
                         (sys,sys->collated
                              [*(int *)(*(long *)(s.__glibc_reserved[2] + 0x78) +
                                        (long)file.index * 0xc + 8)].path);
      strcat(sys->temp,pcVar2 + (long)*(int *)(s.__glibc_reserved[2] + 0x10) + 1);
      iVar1 = stat(sys->temp,(stat *)local_b8);
      if (iVar1 == 0) {
        *(undefined4 *)(*(long *)(s.__glibc_reserved[2] + 0x78) + (long)file.index * 0xc) =
             (undefined4)s.st_rdev;
      }
    }
    sys_local._4_4_ = *(int *)(*(long *)(s.__glibc_reserved[2] + 0x78) + (long)file.index * 0xc);
  }
  return sys_local._4_4_;
}

Assistant:

int assetsys_file_size( assetsys_t* sys, assetsys_file_t file )
    {
    int mount_index = assetsys_internal_find_mount_index( sys, file.mount, file.path );
    if( mount_index < 0 ) return 0;

    struct assetsys_internal_mount_t* mount = &sys->mounts[ mount_index ];
    if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR )
        {
        strcpy( sys->temp, assetsys_internal_get_string( sys, mount->path ) );
        strcat( sys->temp, *sys->temp == '\0' ? "" : "/" );
        strcat( sys->temp, assetsys_internal_get_string( sys, 
            sys->collated[ mount->files[ file.index ].collated_index ].path ) + mount->mount_len + 1 );
        struct stat s;
        if( stat( sys->temp, &s ) == 0 )
            mount->files[ file.index ].size = (int) s.st_size;
        }
        
    return mount->files[ file.index ].size;
    }